

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

UniValue * blockheaderToJSON(CBlockIndex *tip,CBlockIndex *blockindex)

{
  UniValue *this;
  long in_RDX;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *result;
  int confirmations;
  CBlockIndex *pnext;
  undefined4 in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  CBlockIndex **in_stack_fffffffffffff680;
  CBlockIndex *in_stack_fffffffffffff688;
  CBlockIndex *in_stack_fffffffffffff690;
  base_blob<256U> *this_00;
  CBlockIndex *in_stack_fffffffffffff698;
  uint *in_stack_fffffffffffff6a0;
  char *in_stack_fffffffffffff6a8;
  allocator<char> *fmt;
  UniValue *in_stack_fffffffffffff6b0;
  UniValue *val;
  UniValue *in_stack_fffffffffffff6b8;
  UniValue *in_stack_fffffffffffff6c0;
  UniValue *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  allocator<char> local_8ac;
  undefined1 local_8ab;
  undefined1 local_8aa [15];
  allocator<char> local_89b;
  allocator<char> local_89a;
  undefined1 local_899 [14];
  undefined1 local_88b;
  undefined1 local_88a [2];
  allocator<char> local_888;
  allocator<char> local_887;
  allocator<char> local_886;
  allocator<char> local_885;
  int local_884;
  undefined8 local_880;
  allocator<char> local_871 [2153];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffff688,(char *)in_stack_fffffffffffff680,
             in_stack_fffffffffffff67c,(RecursiveMutex *)0x53c186);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff690);
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff698,
                     (VType)((ulong)in_stack_fffffffffffff690 >> 0x20),
                     (string *)in_stack_fffffffffffff688);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,
             (allocator<char> *)in_stack_fffffffffffff6b8);
  CBlockIndex::GetBlockHash(in_stack_fffffffffffff688);
  base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff690);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffff6b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6b0);
  UniValue::pushKV(in_stack_fffffffffffff6c0,(string *)in_stack_fffffffffffff6b8,
                   in_stack_fffffffffffff6b0);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator(local_871);
  local_884 = ComputeNextBlockAndDepth
                        (in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                         in_stack_fffffffffffff680);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,
             (allocator<char> *)in_stack_fffffffffffff6b8);
  UniValue::UniValue<int_&,_int,_true>(in_stack_fffffffffffff6b8,(int *)in_stack_fffffffffffff6b0);
  UniValue::pushKV(in_stack_fffffffffffff6c0,(string *)in_stack_fffffffffffff6b8,
                   in_stack_fffffffffffff6b0);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator(&local_885);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,
             (allocator<char> *)in_stack_fffffffffffff6b8);
  UniValue::UniValue<const_int_&,_int,_true>
            (in_stack_fffffffffffff6b8,(int *)in_stack_fffffffffffff6b0);
  UniValue::pushKV(in_stack_fffffffffffff6c0,(string *)in_stack_fffffffffffff6b8,
                   in_stack_fffffffffffff6b0);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator(&local_886);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,
             (allocator<char> *)in_stack_fffffffffffff6b8);
  UniValue::UniValue<const_int_&,_int,_true>
            (in_stack_fffffffffffff6b8,(int *)in_stack_fffffffffffff6b0);
  UniValue::pushKV(in_stack_fffffffffffff6c0,(string *)in_stack_fffffffffffff6b8,
                   in_stack_fffffffffffff6b0);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator(&local_887);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,
             (allocator<char> *)in_stack_fffffffffffff6b8);
  tinyformat::format<int>(in_stack_fffffffffffff6a8,(int *)in_stack_fffffffffffff6a0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffff6b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6b0);
  UniValue::pushKV(in_stack_fffffffffffff6c0,(string *)in_stack_fffffffffffff6b8,
                   in_stack_fffffffffffff6b0);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator(&local_888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff6c8,(char *)in_stack_fffffffffffff6c0,
             (allocator<char> *)in_stack_fffffffffffff6b8);
  base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff690);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffff6b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff6b0);
  UniValue::pushKV(in_stack_fffffffffffff6c0,(string *)in_stack_fffffffffffff6b8,
                   in_stack_fffffffffffff6b0);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator((allocator<char> *)(local_88a + 1));
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)in_stack_fffffffffffff6c0,(allocator<char> *)in_stack_fffffffffffff6b8)
  ;
  UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>
            (in_stack_fffffffffffff6b8,&in_stack_fffffffffffff6b0->typ);
  UniValue::pushKV(in_stack_fffffffffffff6c0,(string *)in_stack_fffffffffffff6b8,
                   in_stack_fffffffffffff6b0);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator((allocator<char> *)local_88a);
  this_01 = (UniValue *)&local_88b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this_01,(allocator<char> *)in_stack_fffffffffffff6b8);
  this = (UniValue *)CBlockIndex::GetMedianTimePast(in_stack_fffffffffffff698);
  local_899._1_8_ = this;
  UniValue::UniValue<long,_long,_true>(this,(long *)in_stack_fffffffffffff6b0);
  UniValue::pushKV(this_01,(string *)this,in_stack_fffffffffffff6b0);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator((allocator<char> *)&local_88b);
  val = (UniValue *)local_899;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this_01,(allocator<char> *)this);
  UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(this,&val->typ);
  UniValue::pushKV(this_01,(string *)this,val);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator((allocator<char> *)local_899);
  fmt = &local_89a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this_01,(allocator<char> *)this);
  tinyformat::format<unsigned_int>((char *)fmt,in_stack_fffffffffffff6a0);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
  UniValue::pushKV(this_01,(string *)this,val);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator(&local_89a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this_01,(allocator<char> *)this);
  local_8aa._2_8_ = GetDifficulty(in_stack_fffffffffffff688);
  UniValue::UniValue<double,_double,_true>(this,(double *)val);
  UniValue::pushKV(this_01,(string *)this,val);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator(&local_89b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this_01,(allocator<char> *)this);
  base_uint<256u>::GetHex_abi_cxx11_((base_uint<256U> *)in_stack_fffffffffffff690);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
  UniValue::pushKV(this_01,(string *)this,val);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator((allocator<char> *)(local_8aa + 1));
  this_00 = (base_blob<256U> *)local_8aa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_02,(char *)this_01,(allocator<char> *)this);
  UniValue::UniValue<const_unsigned_int_&,_unsigned_int,_true>(this,&val->typ);
  UniValue::pushKV(this_01,(string *)this,val);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
  std::allocator<char>::~allocator((allocator<char> *)local_8aa);
  if (*(long *)(in_RDX + 8) != 0) {
    in_stack_fffffffffffff688 = (CBlockIndex *)&local_8ab;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_02,(char *)this_01,(allocator<char> *)this);
    CBlockIndex::GetBlockHash(in_stack_fffffffffffff688);
    base_blob<256u>::GetHex_abi_cxx11_(this_00);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
    UniValue::pushKV(this_01,(string *)this,val);
    UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    std::allocator<char>::~allocator((allocator<char> *)&local_8ab);
  }
  if (local_880 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_02,(char *)this_01,(allocator<char> *)this);
    CBlockIndex::GetBlockHash(in_stack_fffffffffffff688);
    base_blob<256u>::GetHex_abi_cxx11_(this_00);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
    UniValue::pushKV(this_01,(string *)this,val);
    UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff67c,in_stack_fffffffffffff678));
    std::allocator<char>::~allocator(&local_8ac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue blockheaderToJSON(const CBlockIndex& tip, const CBlockIndex& blockindex)
{
    // Serialize passed information without accessing chain state of the active chain!
    AssertLockNotHeld(cs_main); // For performance reasons

    UniValue result(UniValue::VOBJ);
    result.pushKV("hash", blockindex.GetBlockHash().GetHex());
    const CBlockIndex* pnext;
    int confirmations = ComputeNextBlockAndDepth(tip, blockindex, pnext);
    result.pushKV("confirmations", confirmations);
    result.pushKV("height", blockindex.nHeight);
    result.pushKV("version", blockindex.nVersion);
    result.pushKV("versionHex", strprintf("%08x", blockindex.nVersion));
    result.pushKV("merkleroot", blockindex.hashMerkleRoot.GetHex());
    result.pushKV("time", blockindex.nTime);
    result.pushKV("mediantime", blockindex.GetMedianTimePast());
    result.pushKV("nonce", blockindex.nNonce);
    result.pushKV("bits", strprintf("%08x", blockindex.nBits));
    result.pushKV("difficulty", GetDifficulty(blockindex));
    result.pushKV("chainwork", blockindex.nChainWork.GetHex());
    result.pushKV("nTx", blockindex.nTx);

    if (blockindex.pprev)
        result.pushKV("previousblockhash", blockindex.pprev->GetBlockHash().GetHex());
    if (pnext)
        result.pushKV("nextblockhash", pnext->GetBlockHash().GetHex());
    return result;
}